

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O0

int xmlTextReaderSchemaValidateInternal
              (xmlTextReaderPtr reader,char *xsd,xmlSchemaValidCtxtPtr ctxt,int options)

{
  xmlSchemaParserCtxtPtr ctxt_00;
  xmlSchemaPtr pxVar1;
  xmlSchemaValidCtxtPtr pxVar2;
  xmlSchemaSAXPlugPtr pxVar3;
  xmlSchemaParserCtxtPtr pctxt;
  int options_local;
  xmlSchemaValidCtxtPtr ctxt_local;
  char *xsd_local;
  xmlTextReaderPtr reader_local;
  
  if (reader == (xmlTextReaderPtr)0x0) {
    reader_local._4_4_ = -1;
  }
  else if ((xsd == (char *)0x0) || (ctxt == (xmlSchemaValidCtxtPtr)0x0)) {
    if (((xsd == (char *)0x0) && (ctxt == (xmlSchemaValidCtxtPtr)0x0)) ||
       ((reader->mode == 0 && (reader->ctxt != (xmlParserCtxtPtr)0x0)))) {
      if (reader->xsdPlug != (xmlSchemaSAXPlugPtr)0x0) {
        xmlSchemaSAXUnplug(reader->xsdPlug);
        reader->xsdPlug = (xmlSchemaSAXPlugPtr)0x0;
      }
      if (reader->xsdValidCtxt != (xmlSchemaValidCtxtPtr)0x0) {
        if (reader->xsdPreserveCtxt == 0) {
          xmlSchemaFreeValidCtxt(reader->xsdValidCtxt);
        }
        reader->xsdValidCtxt = (xmlSchemaValidCtxtPtr)0x0;
      }
      reader->xsdPreserveCtxt = 0;
      if (reader->xsdSchemas != (xmlSchemaPtr)0x0) {
        xmlSchemaFree(reader->xsdSchemas);
        reader->xsdSchemas = (xmlSchemaPtr)0x0;
      }
      if ((xsd == (char *)0x0) && (ctxt == (xmlSchemaValidCtxtPtr)0x0)) {
        reader_local._4_4_ = 0;
      }
      else {
        if (xsd == (char *)0x0) {
          reader->xsdValidCtxt = ctxt;
          reader->xsdPreserveCtxt = 1;
          pxVar3 = xmlSchemaSAXPlug(reader->xsdValidCtxt,&reader->ctxt->sax,&reader->ctxt->userData)
          ;
          reader->xsdPlug = pxVar3;
          if (reader->xsdPlug == (xmlSchemaSAXPlugPtr)0x0) {
            reader->xsdValidCtxt = (xmlSchemaValidCtxtPtr)0x0;
            reader->xsdPreserveCtxt = 0;
            return -1;
          }
        }
        else {
          ctxt_00 = xmlSchemaNewParserCtxt(xsd);
          if (reader->errorFunc != (xmlTextReaderErrorFunc)0x0) {
            xmlSchemaSetParserErrors
                      (ctxt_00,xmlTextReaderValidityErrorRelay,xmlTextReaderValidityWarningRelay,
                       reader);
          }
          pxVar1 = xmlSchemaParse(ctxt_00);
          reader->xsdSchemas = pxVar1;
          xmlSchemaFreeParserCtxt(ctxt_00);
          if (reader->xsdSchemas == (xmlSchemaPtr)0x0) {
            return -1;
          }
          pxVar2 = xmlSchemaNewValidCtxt(reader->xsdSchemas);
          reader->xsdValidCtxt = pxVar2;
          if (reader->xsdValidCtxt == (xmlSchemaValidCtxtPtr)0x0) {
            xmlSchemaFree(reader->xsdSchemas);
            reader->xsdSchemas = (xmlSchemaPtr)0x0;
            return -1;
          }
          pxVar3 = xmlSchemaSAXPlug(reader->xsdValidCtxt,&reader->ctxt->sax,&reader->ctxt->userData)
          ;
          reader->xsdPlug = pxVar3;
          if (reader->xsdPlug == (xmlSchemaSAXPlugPtr)0x0) {
            xmlSchemaFree(reader->xsdSchemas);
            reader->xsdSchemas = (xmlSchemaPtr)0x0;
            xmlSchemaFreeValidCtxt(reader->xsdValidCtxt);
            reader->xsdValidCtxt = (xmlSchemaValidCtxtPtr)0x0;
            return -1;
          }
        }
        xmlSchemaValidateSetLocator(reader->xsdValidCtxt,xmlTextReaderLocator,reader);
        if (reader->errorFunc != (xmlTextReaderErrorFunc)0x0) {
          xmlSchemaSetValidErrors
                    (reader->xsdValidCtxt,xmlTextReaderValidityErrorRelay,
                     xmlTextReaderValidityWarningRelay,reader);
        }
        if (reader->sErrorFunc != (xmlStructuredErrorFunc)0x0) {
          xmlSchemaSetValidStructuredErrors
                    (reader->xsdValidCtxt,xmlTextReaderValidityStructuredRelay,reader);
        }
        reader->xsdValidErrors = 0;
        reader->validate = XML_TEXTREADER_VALIDATE_XSD;
        reader_local._4_4_ = 0;
      }
    }
    else {
      reader_local._4_4_ = -1;
    }
  }
  else {
    reader_local._4_4_ = -1;
  }
  return reader_local._4_4_;
}

Assistant:

static int
xmlTextReaderSchemaValidateInternal(xmlTextReaderPtr reader,
				    const char *xsd,
				    xmlSchemaValidCtxtPtr ctxt,
				    int options ATTRIBUTE_UNUSED)
{
    if (reader == NULL)
        return(-1);

    if ((xsd != NULL) && (ctxt != NULL))
	return(-1);

    if (((xsd != NULL) || (ctxt != NULL)) &&
	((reader->mode != XML_TEXTREADER_MODE_INITIAL) ||
        (reader->ctxt == NULL)))
	return(-1);

    /* Cleanup previous validation stuff. */
    if (reader->xsdPlug != NULL) {
	xmlSchemaSAXUnplug(reader->xsdPlug);
	reader->xsdPlug = NULL;
    }
    if (reader->xsdValidCtxt != NULL) {
	if (! reader->xsdPreserveCtxt)
	    xmlSchemaFreeValidCtxt(reader->xsdValidCtxt);
	reader->xsdValidCtxt = NULL;
    }
    reader->xsdPreserveCtxt = 0;
    if (reader->xsdSchemas != NULL) {
	xmlSchemaFree(reader->xsdSchemas);
	reader->xsdSchemas = NULL;
    }

    if ((xsd == NULL) && (ctxt == NULL)) {
	/* We just want to deactivate the validation, so get out. */
	return(0);
    }

    if (xsd != NULL) {
	xmlSchemaParserCtxtPtr pctxt;
	/* Parse the schema and create validation environment. */
	pctxt = xmlSchemaNewParserCtxt(xsd);
	if (reader->errorFunc != NULL) {
	    xmlSchemaSetParserErrors(pctxt,
		xmlTextReaderValidityErrorRelay,
		xmlTextReaderValidityWarningRelay,
		reader);
	}
	reader->xsdSchemas = xmlSchemaParse(pctxt);
	xmlSchemaFreeParserCtxt(pctxt);
	if (reader->xsdSchemas == NULL)
	    return(-1);
	reader->xsdValidCtxt = xmlSchemaNewValidCtxt(reader->xsdSchemas);
	if (reader->xsdValidCtxt == NULL) {
	    xmlSchemaFree(reader->xsdSchemas);
	    reader->xsdSchemas = NULL;
	    return(-1);
	}
	reader->xsdPlug = xmlSchemaSAXPlug(reader->xsdValidCtxt,
	    &(reader->ctxt->sax),
	    &(reader->ctxt->userData));
	if (reader->xsdPlug == NULL) {
	    xmlSchemaFree(reader->xsdSchemas);
	    reader->xsdSchemas = NULL;
	    xmlSchemaFreeValidCtxt(reader->xsdValidCtxt);
	    reader->xsdValidCtxt = NULL;
	    return(-1);
	}
    } else {
	/* Use the given validation context. */
	reader->xsdValidCtxt = ctxt;
	reader->xsdPreserveCtxt = 1;
	reader->xsdPlug = xmlSchemaSAXPlug(reader->xsdValidCtxt,
	    &(reader->ctxt->sax),
	    &(reader->ctxt->userData));
	if (reader->xsdPlug == NULL) {
	    reader->xsdValidCtxt = NULL;
	    reader->xsdPreserveCtxt = 0;
	    return(-1);
	}
    }
    xmlSchemaValidateSetLocator(reader->xsdValidCtxt,
                                xmlTextReaderLocator,
				(void *) reader);
    /*
    * Redirect the validation context's error channels to use
    * the reader channels.
    * TODO: In case the user provides the validation context we
    *   could make this redirection optional.
    */
    if (reader->errorFunc != NULL) {
	xmlSchemaSetValidErrors(reader->xsdValidCtxt,
			 xmlTextReaderValidityErrorRelay,
			 xmlTextReaderValidityWarningRelay,
			 reader);
    }
	if (reader->sErrorFunc != NULL) {
		xmlSchemaSetValidStructuredErrors(reader->xsdValidCtxt,
			xmlTextReaderValidityStructuredRelay,
			reader);
    }
    reader->xsdValidErrors = 0;
    reader->validate = XML_TEXTREADER_VALIDATE_XSD;
    return(0);
}